

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::indexToOffsetTest<false>(ViewTest *this)

{
  int *data;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  undefined8 *puVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_03;
  ulong *puVar2;
  reference piVar3;
  size_t sVar4;
  size_t index;
  ulong uVar5;
  size_t index_00;
  long *plVar6;
  size_t index_3;
  size_t *psVar7;
  allocator_type local_f9;
  size_t offset_1;
  size_t offset;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> c;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  begin._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin._M_current = 3;
  begin._M_current[1] = 2;
  begin._M_current[2] = 4;
  data = this->data_;
  offset = CONCAT44(offset._4_4_,1);
  c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                         .super__Vector_impl_data._M_start._4_4_,1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&offset,
             (CoordinateOrder *)&c,(allocator_type *)&offset_1);
  for (uVar5 = 0; uVar5 < v.geometry_.size_; uVar5 = uVar5 + 1) {
    offset = 0;
    andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset(&v,uVar5,&offset);
    c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,uVar5 == offset);
    test((bool *)&c);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&offset,3,(allocator_type *)&v
            );
  *(undefined8 *)offset = 3;
  *(undefined8 *)(offset + 8) = 2;
  *(undefined8 *)(offset + 0x10) = 4;
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffff00000000);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )offset,local_e8,data,(CoordinateOrder *)&shape,(CoordinateOrder *)&c,
             (allocator_type *)&offset_1);
  c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                         .super__Vector_impl_data._M_start._4_4_,1);
  offset_1 = CONCAT44(offset_1._4_4_,1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&shape,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )offset,local_e8,data,(CoordinateOrder *)&c,(CoordinateOrder *)&offset_1,&local_f9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&c,3,(allocator_type *)&offset_1);
  *c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  uVar5 = 0;
  index_00 = 0;
  puVar2 = c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  while (uVar5 < *(ulong *)offset) {
    puVar2[1] = 0;
    uVar5 = 0;
    sVar4 = offset;
    while (uVar5 < *(ulong *)(sVar4 + 8)) {
      puVar2[2] = 0;
      uVar5 = puVar2[2];
      while (uVar5 < *(ulong *)(sVar4 + 0x10)) {
        offset_1 = 0;
        andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset
                  (&v,index_00,&offset_1);
        sVar4 = offset_1;
        piVar3 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&shape,
                            *c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                            c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[1],
                            c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[2]);
        local_f9 = (allocator_type)(sVar4 == (long)*piVar3);
        test((bool *)&local_f9);
        index_00 = index_00 + 1;
        uVar5 = c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[2] + 1;
        c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[2] = uVar5;
        puVar2 = c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar4 = offset;
      }
      uVar5 = puVar2[1] + 1;
      puVar2[1] = uVar5;
    }
    uVar5 = *puVar2 + 1;
    *puVar2 = uVar5;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)
             &shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&offset);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  begin_00._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_00._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_00._M_current = 3;
  begin_00._M_current[1] = 2;
  begin_00._M_current[2] = 4;
  offset = offset & 0xffffffff00000000;
  c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                         .super__Vector_impl_data._M_start._4_4_,1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&offset,
             (CoordinateOrder *)&c,(allocator_type *)&offset_1);
  psVar7 = &DAT_001cb0c0;
  for (uVar5 = 0; uVar5 < v.geometry_.size_; uVar5 = uVar5 + 1) {
    offset = 0;
    andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset(&v,uVar5,&offset);
    c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,offset == *psVar7);
    test((bool *)&c);
    psVar7 = psVar7 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  begin_01._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_01._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin_01._M_current = 3;
  begin_01._M_current[1] = 2;
  begin_01._M_current[2] = 4;
  offset = offset & 0xffffffff00000000;
  c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffff00000000);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_01,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&offset,
             (CoordinateOrder *)&c,(allocator_type *)&offset_1);
  for (uVar5 = 0; uVar5 < v.geometry_.size_; uVar5 = uVar5 + 1) {
    offset = 0;
    andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset(&v,uVar5,&offset);
    c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,uVar5 == offset);
    test((bool *)&c);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  puVar1 = (undefined8 *)
           CONCAT44(shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start._4_4_,
                    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start._0_4_);
  *puVar1 = 3;
  puVar1[1] = 4;
  puVar1[2] = 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&offset,3,(allocator_type *)&v
            );
  *(undefined8 *)offset = 2;
  *(undefined8 *)(offset + 8) = 10;
  *(undefined8 *)(offset + 0x10) = 0x23;
  begin_02._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_02._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                         .super__Vector_impl_data._M_start._4_4_,1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_02,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )offset,this->data100_ + 0x1e,(CoordinateOrder *)&c,(allocator_type *)&offset_1);
  plVar6 = &DAT_001cb180;
  for (uVar5 = 0; uVar5 < v.geometry_.size_; uVar5 = uVar5 + 1) {
    c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset(&v,uVar5,(size_t *)&c);
    offset_1 = CONCAT71(offset_1._1_7_,
                        c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start == (pointer)(*plVar6 + -0x1e));
    test((bool *)&offset_1);
    plVar6 = plVar6 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&offset);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  puVar1 = (undefined8 *)
           CONCAT44(shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start._4_4_,
                    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start._0_4_);
  *puVar1 = 3;
  puVar1[1] = 4;
  puVar1[2] = 2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&offset,3,(allocator_type *)&v
            );
  *(undefined8 *)offset = 2;
  *(undefined8 *)(offset + 8) = 10;
  *(undefined8 *)(offset + 0x10) = 0x23;
  begin_03._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_03._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffff00000000);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_03,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )offset,this->data100_ + 0x1e,(CoordinateOrder *)&c,(allocator_type *)&offset_1);
  plVar6 = &DAT_001cb240;
  for (uVar5 = 0; uVar5 < v.geometry_.size_; uVar5 = uVar5 + 1) {
    c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset(&v,uVar5,(size_t *)&c);
    offset_1 = CONCAT71(offset_1._1_7_,
                        c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start == (pointer)(*plVar6 + -0x1e));
    test((bool *)&offset_1);
    plVar6 = plVar6 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&offset);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void ViewTest::indexToOffsetTest() {
    // test cases: (externalFirstMajorOrder, internalFirstMajorOrder)
    // (false, false)
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::LastMajorOrder);

        std::size_t trueOffset = 0;
        for(std::size_t index=0; index<v.size(); ++index) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == trueOffset);
            ++trueOffset;
        }
    }
    // (false, true)
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::FirstMajorOrder);
        andres::View<int> w(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::LastMajorOrder);
    
        std::vector<std::size_t> c(3);
        std::size_t index = 0;
        for(c[0]=0; c[0]<shape[0]; ++c[0]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[2]=0; c[2]<shape[2]; ++c[2]) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == static_cast<std::size_t>(w(c[0], c[1], c[2])));
            ++index;
        }
    
    }
    // (true, false)
    {
        std::size_t list[] = {0, 8, 16, 4, 12, 20, 1, 9, 17, 5, 13, 21, 
            2, 10, 18, 6, 14, 22, 3, 11, 19, 7, 15, 23}; 
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::FirstMajorOrder, andres::LastMajorOrder);

        for(std::size_t index=0; index<v.size(); ++index) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == list[index]);
        }
    }
    
    // (true, true)
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::FirstMajorOrder, andres::FirstMajorOrder);

        std::size_t trueOffset = 0;
        for(std::size_t index=0; index<v.size(); ++index) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == trueOffset);
            ++trueOffset;
        }
    }

    // test also with non-trivial strides and non-zero offset
    // (false)
    {
        std::size_t list[] = {30, 32, 34, 40, 42, 44, 50, 52, 54, 60, 62, 64, 
            65, 67, 69, 75, 77, 79, 85, 87, 89, 95, 97, 99}; 
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4;
        shape[2] = 2;
        std::vector<std::size_t> strides(3);
        strides[0] = 2;
        strides[1] = 10;
        strides[2] = 35;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
            data100_+30, andres::LastMajorOrder);
        
        for(std::size_t index=0; index<v.size(); ++index) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == list[index]-30);
        }
    }
    // (true)
    {
        std::size_t list[] = {30, 65, 40, 75, 50, 85, 60, 95, 32, 67, 42, 77, 
            52, 87, 62, 97, 34, 69, 44, 79, 54, 89, 64, 99};
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4;
        shape[2] = 2;
        std::vector<std::size_t> strides(3);
        strides[0] = 2;
        strides[1] = 10;
        strides[2] = 35;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
            data100_+30, andres::FirstMajorOrder);
        
        for(std::size_t index=0; index<v.size(); ++index) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == list[index]-30);
        }
    }
}